

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::ShouldGenerateStringReplaceFastPath(Lowerer *this,Instr *callInstr,IntConstType argCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  byte local_4b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Instr *local_48;
  Instr *argInstr;
  StackSym *sym;
  SymOpnd *src2;
  Opnd *linkOpnd;
  IntConstType argCount_local;
  Instr *callInstr_local;
  Lowerer *this_local;
  
  linkOpnd = (Opnd *)argCount;
  argCount_local = (IntConstType)callInstr;
  callInstr_local = (Instr *)this;
  src2 = (SymOpnd *)IR::Instr::GetSrc2(callInstr);
  if (linkOpnd != (Opnd *)0x2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4fa9,"(argCount == 2)","argCount == 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  while( true ) {
    bVar2 = IR::Opnd::IsSymOpnd(&src2->super_Opnd);
    if (!bVar2) {
      return true;
    }
    sym = (StackSym *)IR::Opnd::AsSymOpnd(&src2->super_Opnd);
    argInstr = (Instr *)Sym::AsStackSym(*(Sym **)&(sym->super_Sym).m_id);
    if (((ulong)argInstr->m_prev & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4faf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_48 = (Instr *)argInstr->globOptInstrString;
    if ((long)linkOpnd < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4fb2,"(argCount >= 0)","argCount >= 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if ((linkOpnd == (Opnd *)0x2) || (local_4b = 0, linkOpnd == (Opnd *)0x0)) {
      pOVar4 = IR::Instr::GetSrc1(local_48);
      local_4a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOVar4);
      bVar2 = ValueType::IsLikelyString((ValueType *)&local_4a.field_0);
      local_4b = bVar2 ^ 0xff;
    }
    if ((local_4b & 1) != 0) break;
    if (linkOpnd == (Opnd *)&DAT_00000001) {
      pOVar4 = IR::Instr::GetSrc1(local_48);
      bVar2 = IR::Opnd::IsTaggedInt(pOVar4);
      if (bVar2) {
        return false;
      }
    }
    linkOpnd = (Opnd *)&linkOpnd[-1].field_0xf;
    src2 = (SymOpnd *)IR::Instr::GetSrc2(local_48);
  }
  return false;
}

Assistant:

bool
Lowerer::ShouldGenerateStringReplaceFastPath(IR::Instr * callInstr, IntConstType argCount)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // argout sequence:
    // arg1(s12)<0>.var = ArgOut_A       s2.var, s11.var                         #0014   <---- a
    // arg2(s13)<4>.var = ArgOut_A       s3.var, arg1(s12)<0>.var                #0018   <---- b
    // arg3(s14)<8>.var = ArgOut_A       s4.var, arg2(s13)<4>.var                #001c   <---- c
    // s0[LikelyString].var = CallI      s5[ffunc].var, arg3(s14)<8>.var         #0020

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Assert(argCount == 2);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        // check to see if 'a' and 'c' are likely strings
        if((argCount == 2 || argCount == 0) && (!argInstr->GetSrc1()->GetValueType().IsLikelyString()))
        {
            return false;
        }
        // we want 'b' to be regex. Don't generate fastpath if it is a tagged int
        if((argCount == 1) && (argInstr->GetSrc1()->IsTaggedInt()))
        {
            return false;
        }
        argCount--;
        linkOpnd = argInstr->GetSrc2();
    }
    return true;
}